

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.h
# Opt level: O0

void __thiscall
flagser_parameters::flagser_parameters(flagser_parameters *this,named_arguments_t *named_arguments)

{
  bool bVar1;
  byte bVar2;
  unsigned_short uVar3;
  uint uVar4;
  int iVar5;
  unsigned_long uVar6;
  char *pcVar7;
  pointer pvVar8;
  string *in_RSI;
  unsigned_short *in_RDI;
  float fVar9;
  string parameter;
  const_iterator it;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
  *in_stack_fffffffffffffa68;
  undefined7 in_stack_fffffffffffffa70;
  undefined1 in_stack_fffffffffffffa77;
  char *in_stack_fffffffffffffa78;
  string *in_stack_fffffffffffffa80;
  named_arguments_t *in_stack_fffffffffffffa88;
  allocator *paVar10;
  string *in_stack_fffffffffffffaa0;
  string *in_stack_fffffffffffffaa8;
  undefined7 in_stack_fffffffffffffab0;
  undefined1 in_stack_fffffffffffffab7;
  named_arguments_t *in_stack_fffffffffffffb30;
  undefined6 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3e;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_368;
  allocator local_359;
  string local_358 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_338;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_330;
  allocator local_321;
  string local_320 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_300;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_2f8;
  allocator local_2e9;
  string local_2e8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_2c8;
  allocator local_2b9;
  string local_2b8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_298;
  allocator local_289;
  string local_288 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_268;
  allocator local_25a;
  allocator local_259;
  string local_258 [32];
  string local_238 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_218;
  allocator local_209;
  string local_208 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1e0;
  allocator local_1d1;
  string local_1d0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1b0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_1a8;
  allocator local_199;
  string local_198 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_178;
  allocator local_16a;
  allocator local_169;
  string local_168 [32];
  string local_148 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_128;
  allocator local_119;
  string local_118 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_f8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_f0;
  allocator local_e1;
  string local_e0 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_c0;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_b8;
  allocator local_a9;
  string local_a8 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_88;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_true>
  local_30;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [20];
  allocator local_11;
  string *local_10;
  
  local_10 = in_RSI;
  uVar3 = std::numeric_limits<unsigned_short>::max();
  *in_RDI = uVar3;
  in_RDI[1] = 0;
  in_RDI[2] = 2;
  fVar9 = std::numeric_limits<float>::max();
  *(float *)(in_RDI + 4) = fVar9;
  *(undefined1 *)(in_RDI + 6) = 0;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(undefined1 *)(in_RDI + 7) = 0;
  *(undefined1 *)((long)in_RDI + 0xf) = 0;
  uVar6 = std::numeric_limits<unsigned_long>::max();
  *(unsigned_long *)(in_RDI + 8) = uVar6;
  uVar4 = std::thread::hardware_concurrency();
  *(ulong *)(in_RDI + 0xc) = (ulong)uVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x10),"flagser",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x20),"",local_25);
  std::allocator<char>::~allocator((allocator<char> *)local_25);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x30),"barcode",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x40),"",&local_27);
  std::allocator<char>::~allocator((allocator<char> *)&local_27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(in_RDI + 0x50),"",&local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_28);
  std::unique_ptr<filtration_algorithm_t,std::default_delete<filtration_algorithm_t>>::
  unique_ptr<std::default_delete<filtration_algorithm_t>,void>
            ((unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_> *)
             CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70));
  std::__detail::
  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
  ::_Node_const_iterator
            ((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
              *)0x1a1308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"out",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"Please provide an output filename via \"--out filename\" .",&local_79);
  pcVar7 = get_argument_or_fail
                     ((named_arguments_t *)
                      CONCAT17(in_stack_fffffffffffffab7,in_stack_fffffffffffffab0),
                      in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x20),pcVar7);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a8,"in-format",&local_a9);
  local_88._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a144e);
  local_30._M_cur = local_88._M_cur;
  local_b8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_30,&local_b8);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_a9);
  if (bVar1) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a14e0);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x10),pvVar8->second);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"out-format",&local_e1);
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a16ed);
  local_30._M_cur = local_c0._M_cur;
  local_f0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_30,&local_f0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  if (bVar1) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a177c);
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),pvVar8->second);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_118,"approximate",&local_119);
  local_f8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a1836);
  local_30._M_cur = local_f8._M_cur;
  local_128._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_30,&local_128);
  std::__cxx11::string::~string(local_118);
  std::allocator<char>::~allocator((allocator<char> *)&local_119);
  if (bVar1) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a18c5);
    iVar5 = atoi(pvVar8->second);
    *(long *)(in_RDI + 8) = (long)iVar5;
    *(undefined1 *)(in_RDI + 7) = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_168,"undirected",&local_169);
  pcVar7 = get_argument_or_default
                     (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,pcVar7,&local_16a);
  bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                          (char *)in_stack_fffffffffffffa68);
  *(bool *)((long)in_RDI + 0xd) = bVar1;
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_16a);
  std::__cxx11::string::~string(local_168);
  std::allocator<char>::~allocator((allocator<char> *)&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"components",&local_199);
  local_178._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a1a89);
  local_1a8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_178,&local_1a8);
  *(bool *)(in_RDI + 6) = bVar1;
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"max-dim",&local_1d1);
  local_1b0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a1b4c);
  local_30._M_cur = local_1b0._M_cur;
  local_1e0._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_30,&local_1e0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  if (bVar1) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a1bde);
    iVar5 = atoi(pvVar8->second);
    *in_RDI = (unsigned_short)iVar5;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_208,"min-dim",&local_209);
  local_1e8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a1d72);
  local_30._M_cur = local_1e8._M_cur;
  local_218._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar2 = std::__detail::operator!=(&local_30,&local_218);
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  if ((bVar2 & 1) != 0) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a1e01);
    iVar5 = atoi(pvVar8->second);
    in_RDI[1] = (unsigned_short)iVar5;
  }
  bVar1 = has_zero_filtration_and_no_explicit_output
                    ((flagser_parameters *)
                     CONCAT17(bVar2,CONCAT16(in_stack_fffffffffffffb3e,in_stack_fffffffffffffb38)),
                     in_stack_fffffffffffffb30);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x30),"betti");
  }
  paVar10 = &local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"filtration",paVar10);
  pcVar7 = get_argument_or_default
                     (in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,in_stack_fffffffffffffa78)
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,pcVar7,&local_25a);
  get_filtration_computer(local_10);
  std::unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_>::reset
            ((unique_ptr<filtration_algorithm_t,_std::default_delete<filtration_algorithm_t>_> *)
             CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
             (pointer)in_stack_fffffffffffffa68);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_25a);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_288,"threshold",&local_289);
  local_268._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a2015);
  local_30._M_cur = local_268._M_cur;
  local_298._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_30,&local_298);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  if (bVar1) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a20a7);
    pcVar7 = pvVar8->second;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_2b8,pcVar7,&local_2b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
    fVar9 = std::__cxx11::stof((string *)
                               CONCAT17(in_stack_fffffffffffffa77,in_stack_fffffffffffffa70),
                               (size_t *)in_stack_fffffffffffffa68);
    *(float *)(in_RDI + 4) = fVar9;
    std::__cxx11::string::~string(local_2b8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2e8,"threads",&local_2e9);
  local_2c8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a2296);
  local_30._M_cur = local_2c8._M_cur;
  local_2f8._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar2 = std::__detail::operator!=(&local_30,&local_2f8);
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  if ((bVar2 & 1) != 0) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a2319);
    iVar5 = atoi(pvVar8->second);
    *(long *)(in_RDI + 0xc) = (long)iVar5;
  }
  paVar10 = &local_321;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_320,"in-memory",paVar10);
  local_300._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a23ca);
  local_30._M_cur = local_300._M_cur;
  local_330._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar1 = std::__detail::operator!=(&local_30,&local_330);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator((allocator<char> *)&local_321);
  if (bVar1) {
    *(undefined1 *)((long)in_RDI + 0xf) = 1;
  }
  paVar10 = &local_359;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"modulus",paVar10);
  local_338._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::find(in_stack_fffffffffffffa68,(key_type *)0x1a24e3);
  local_30._M_cur = local_338._M_cur;
  local_368._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
       ::end(in_stack_fffffffffffffa68);
  bVar2 = std::__detail::operator!=(&local_30,&local_368);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  if ((bVar2 & 1) != 0) {
    pvVar8 = std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_false,_true>
                           *)0x1a2566);
    iVar5 = atoi(pvVar8->second);
    in_RDI[2] = (unsigned_short)iVar5;
  }
  return;
}

Assistant:

flagser_parameters(const named_arguments_t& named_arguments) {
		named_arguments_t::const_iterator it;

		output_name =
		    get_argument_or_fail(named_arguments, "out", "Please provide an output filename via \"--out filename\" .");

		if ((it = named_arguments.find("in-format")) != named_arguments.end()) { input_format = it->second; }

		if ((it = named_arguments.find("out-format")) != named_arguments.end()) { output_format = it->second; }

		if ((it = named_arguments.find("approximate")) != named_arguments.end()) {
			max_entries = atoi(it->second);
			approximate_computation = true;
		}

		directed = std::string(get_argument_or_default(named_arguments, "undirected", "directed")) != "true";

		split_into_connected_components = named_arguments.find("components") != named_arguments.end();

		if ((it = named_arguments.find("max-dim")) != named_arguments.end()) { max_dimension = atoi(it->second); }

		if ((it = named_arguments.find("min-dim")) != named_arguments.end()) { min_dimension = atoi(it->second); }

		if (has_zero_filtration_and_no_explicit_output(named_arguments)) { output_format = "betti"; }

		filtration_algorithm.reset(
		    get_filtration_computer(get_argument_or_default(named_arguments, "filtration", "zero")));

		if ((it = named_arguments.find("threshold")) != named_arguments.end()) {
			std::string parameter = std::string(it->second);
			threshold = std::stof(parameter, nullptr);
		}

		if ((it = named_arguments.find("threads")) != named_arguments.end()) { nb_threads = atoi(it->second); }

		if ((it = named_arguments.find("in-memory")) != named_arguments.end()) { in_memory = true; }

#ifdef USE_COEFFICIENTS
		if ((it = named_arguments.find("modulus")) != named_arguments.end()) { modulus = atoi(it->second); }
#endif
	}